

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

bool __thiscall
perfetto::protos::gen::JavaHprofConfig::ParseFromArray(JavaHprofConfig *this,void *raw,size_t size)

{
  byte bVar1;
  pointer puVar2;
  _Head_base<0UL,_perfetto::protos::gen::JavaHprofConfig_ContinuousDumpConfig_*,_false> _Var3;
  iterator __position;
  bool bVar4;
  short sVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong *puVar9;
  ulong uVar10;
  pointer pbVar11;
  unsigned_long *puVar12;
  uint8_t cur_byte_2;
  ulong uVar13;
  uint8_t cur_byte_3;
  ulong *puVar14;
  uint8_t cur_byte;
  ulong uVar15;
  uint8_t cur_byte_1;
  ulong *puVar16;
  Field local_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  local_38 = &this->process_cmdline_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(local_38,(this->process_cmdline_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  puVar2 = (this->pid_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->pid_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (this->pid_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  local_50 = &this->pid_;
  local_40 = &this->target_installed_by_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(local_40,(this->target_installed_by_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->ignored_types_,
                    (this->ignored_types_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  (this->unknown_fields_)._M_string_length = 0;
  local_48 = &this->unknown_fields_;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar9 = (ulong *)(size + (long)raw);
  do {
    if (puVar9 <= raw) goto switchD_00233669_caseD_3;
    bVar1 = (byte)*raw;
    uVar8 = (ulong)bVar1;
    puVar14 = (ulong *)((long)raw + 1);
    if ((char)bVar1 < '\0') {
      uVar8 = (ulong)(bVar1 & 0x7f);
      lVar7 = 7;
      do {
        if ((puVar9 <= puVar14) || (0x38 < lVar7 - 7U)) goto switchD_00233669_caseD_3;
        uVar6 = *puVar14;
        puVar14 = (ulong *)((long)puVar14 + 1);
        uVar8 = uVar8 | (ulong)((byte)uVar6 & 0x7f) << ((byte)lVar7 & 0x3f);
        lVar7 = lVar7 + 7;
      } while ((char)(byte)uVar6 < '\0');
    }
    uVar6 = uVar8 >> 3;
    if (((uint)uVar6 == 0) || (puVar9 <= puVar14)) goto switchD_00233669_caseD_3;
    switch((uint)uVar8 & 7) {
    case 0:
      uVar13 = 0;
      uVar10 = 0;
      while( true ) {
        puVar16 = (ulong *)((long)puVar14 + 1);
        uVar13 = (ulong)((byte)*puVar14 & 0x7f) << ((byte)uVar10 & 0x3f) | uVar13;
        if (-1 < (char)(byte)*puVar14) break;
        if ((puVar9 <= puVar16) ||
           (bVar4 = 0x38 < uVar10, uVar10 = uVar10 + 7, puVar14 = puVar16, bVar4))
        goto switchD_00233669_caseD_3;
      }
      uVar10 = uVar13 & 0xffffffff00000000;
      break;
    case 1:
      puVar16 = puVar14 + 1;
      if (puVar9 < puVar16) goto switchD_00233669_caseD_3;
      uVar13 = *puVar14;
      uVar10 = uVar13 & 0xffffffff00000000;
      break;
    case 2:
      puVar14 = (ulong *)((long)puVar14 + 1);
      uVar15 = 0;
      uVar13 = 0;
      puVar16 = puVar14;
      while (uVar15 = (ulong)(*(byte *)((long)puVar16 + -1) & 0x7f) << ((byte)uVar13 & 0x3f) |
                      uVar15, (char)*(byte *)((long)puVar16 + -1) < '\0') {
        if (puVar9 <= puVar16) goto switchD_00233669_caseD_3;
        puVar16 = (ulong *)((long)puVar16 + 1);
        puVar14 = (ulong *)((long)puVar14 + 1);
        bVar4 = 0x38 < uVar13;
        uVar13 = uVar13 + 7;
        if (bVar4) goto switchD_00233669_caseD_3;
      }
      if (uVar15 <= (ulong)((long)puVar9 - (long)puVar14)) {
        uVar10 = (ulong)puVar14 & 0xffffffff00000000;
        puVar16 = (ulong *)((long)puVar16 + uVar15);
        uVar13 = (ulong)puVar14 & 0xffffffff;
        goto LAB_00233745;
      }
    default:
      goto switchD_00233669_caseD_3;
    case 5:
      puVar16 = (ulong *)((long)puVar14 + 4);
      if (puVar9 < puVar16) goto switchD_00233669_caseD_3;
      uVar13 = (ulong)(uint)*puVar14;
      uVar10 = 0;
    }
    uVar15 = 0;
LAB_00233745:
    raw = puVar16;
  } while ((0xffff < (uint)uVar6) || (0xfffffff < uVar15));
  local_60.int_value_ = uVar10 | uVar13 & 0xffffffff;
  uVar13 = uVar6 << 0x20 | uVar15;
  uVar8 = uVar13 | (ulong)((uint)uVar8 & 7) << 0x30;
  local_60.size_ = (uint32_t)uVar15;
  local_60.type_ = (uint8_t)(uVar8 >> 0x30);
  local_60.id_ = (uint16_t)(uVar13 >> 0x20);
  sVar5 = (short)uVar6;
  do {
    if (sVar5 == 0) {
switchD_00233669_caseD_3:
      return puVar9 == (ulong *)raw;
    }
    if ((ushort)uVar6 < 8) {
      (this->_has_field_).super__Base_bitset<1UL>._M_w =
           (this->_has_field_).super__Base_bitset<1UL>._M_w | 1L << ((byte)uVar6 & 0x3f);
    }
    switch((uint)uVar6 & 0xffff) {
    case 1:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>(local_38);
      pbVar11 = (this->process_cmdline_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      goto LAB_002338bf;
    case 2:
      __position._M_current =
           (this->pid_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->pid_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<>
                  (local_50,__position);
        puVar12 = (this->pid_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        *__position._M_current = 0;
        puVar12 = __position._M_current + 1;
        (this->pid_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar12;
      }
      puVar12[-1] = local_60.int_value_;
      break;
    case 3:
      _Var3._M_head_impl =
           (this->continuous_dump_config_).ptr_._M_t.
           super___uniq_ptr_impl<perfetto::protos::gen::JavaHprofConfig_ContinuousDumpConfig,_std::default_delete<perfetto::protos::gen::JavaHprofConfig_ContinuousDumpConfig>_>
           ._M_t.
           super__Tuple_impl<0UL,_perfetto::protos::gen::JavaHprofConfig_ContinuousDumpConfig_*,_std::default_delete<perfetto::protos::gen::JavaHprofConfig_ContinuousDumpConfig>_>
           .
           super__Head_base<0UL,_perfetto::protos::gen::JavaHprofConfig_ContinuousDumpConfig_*,_false>
           ._M_head_impl;
      (**(code **)(*(long *)&(_Var3._M_head_impl)->super_CppMessageObj + 0x20))
                (_Var3._M_head_impl,local_60.int_value_,uVar8 & 0xffffffff);
      break;
    case 4:
      this->min_anonymous_memory_kb_ = (uint32_t)local_60.int_value_;
      break;
    case 5:
      this->dump_smaps_ = local_60.int_value_ != 0;
      break;
    case 6:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>(&this->ignored_types_);
      pbVar11 = (this->ignored_types_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      goto LAB_002338bf;
    case 7:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>(local_40);
      pbVar11 = (this->target_installed_by_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
LAB_002338bf:
      protozero::Field::get(&local_60,pbVar11 + -1);
      break;
    default:
      protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>(&local_60,local_48);
    }
    do {
      if (puVar9 <= raw) goto switchD_00233669_caseD_3;
      bVar1 = (byte)*raw;
      uVar8 = (ulong)(uint)bVar1;
      puVar14 = (ulong *)((long)raw + 1);
      if ((char)bVar1 < '\0') {
        uVar8 = (ulong)(bVar1 & 0x7f);
        lVar7 = 7;
        do {
          if ((puVar9 <= puVar14) || (0x38 < lVar7 - 7U)) goto switchD_00233669_caseD_3;
          uVar6 = *puVar14;
          puVar14 = (ulong *)((long)puVar14 + 1);
          uVar8 = uVar8 | (ulong)((byte)uVar6 & 0x7f) << ((byte)lVar7 & 0x3f);
          lVar7 = lVar7 + 7;
        } while ((char)(byte)uVar6 < '\0');
      }
      uVar6 = uVar8 >> 3;
      if (((uint)uVar6 == 0) || (puVar9 <= puVar14)) goto switchD_00233669_caseD_3;
      switch((uint)uVar8 & 7) {
      case 0:
        uVar13 = 0;
        uVar10 = 0;
        while( true ) {
          puVar16 = (ulong *)((long)puVar14 + 1);
          uVar13 = (ulong)((byte)*puVar14 & 0x7f) << ((byte)uVar10 & 0x3f) | uVar13;
          if (-1 < (char)(byte)*puVar14) break;
          if ((puVar9 <= puVar16) ||
             (bVar4 = 0x38 < uVar10, uVar10 = uVar10 + 7, puVar14 = puVar16, bVar4))
          goto switchD_00233669_caseD_3;
        }
        uVar10 = uVar13 & 0xffffffff00000000;
        break;
      case 1:
        puVar16 = puVar14 + 1;
        if (puVar9 < puVar16) goto switchD_00233669_caseD_3;
        uVar13 = *puVar14;
        uVar10 = uVar13 & 0xffffffff00000000;
        break;
      case 2:
        puVar14 = (ulong *)((long)puVar14 + 1);
        uVar15 = 0;
        uVar13 = 0;
        puVar16 = puVar14;
        while (uVar15 = (ulong)(*(byte *)((long)puVar16 + -1) & 0x7f) << ((byte)uVar13 & 0x3f) |
                        uVar15, (char)*(byte *)((long)puVar16 + -1) < '\0') {
          if (puVar9 <= puVar16) goto switchD_00233669_caseD_3;
          puVar16 = (ulong *)((long)puVar16 + 1);
          puVar14 = (ulong *)((long)puVar14 + 1);
          bVar4 = 0x38 < uVar13;
          uVar13 = uVar13 + 7;
          if (bVar4) goto switchD_00233669_caseD_3;
        }
        if (uVar15 <= (ulong)((long)puVar9 - (long)puVar14)) {
          uVar10 = (ulong)puVar14 & 0xffffffff00000000;
          puVar16 = (ulong *)((long)puVar16 + uVar15);
          uVar13 = (ulong)puVar14 & 0xffffffff;
          goto LAB_00233a70;
        }
      default:
        goto switchD_00233669_caseD_3;
      case 5:
        puVar16 = (ulong *)((long)puVar14 + 4);
        if (puVar9 < puVar16) goto switchD_00233669_caseD_3;
        uVar13 = (ulong)(uint)*puVar14;
        uVar10 = 0;
      }
      uVar15 = 0;
LAB_00233a70:
      raw = puVar16;
    } while ((0xffff < (uint)uVar6) || (0xfffffff < uVar15));
    local_60.int_value_ = uVar10 | uVar13 & 0xffffffff;
    uVar13 = uVar6 << 0x20 | uVar15;
    uVar8 = uVar13 | (uVar8 & 7) << 0x30;
    local_60.size_ = (uint32_t)uVar15;
    local_60.type_ = (uint8_t)(uVar8 >> 0x30);
    local_60.id_ = (uint16_t)(uVar13 >> 0x20);
    sVar5 = (short)uVar6;
  } while( true );
}

Assistant:

bool JavaHprofConfig::ParseFromArray(const void* raw, size_t size) {
  process_cmdline_.clear();
  pid_.clear();
  target_installed_by_.clear();
  ignored_types_.clear();
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* process_cmdline */:
        process_cmdline_.emplace_back();
        field.get(&process_cmdline_.back());
        break;
      case 2 /* pid */:
        pid_.emplace_back();
        field.get(&pid_.back());
        break;
      case 7 /* target_installed_by */:
        target_installed_by_.emplace_back();
        field.get(&target_installed_by_.back());
        break;
      case 3 /* continuous_dump_config */:
        (*continuous_dump_config_).ParseFromArray(field.data(), field.size());
        break;
      case 4 /* min_anonymous_memory_kb */:
        field.get(&min_anonymous_memory_kb_);
        break;
      case 5 /* dump_smaps */:
        field.get(&dump_smaps_);
        break;
      case 6 /* ignored_types */:
        ignored_types_.emplace_back();
        field.get(&ignored_types_.back());
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}